

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O0

void __thiscall LinearScan::SpillInlineeArgs(LinearScan *this,Instr *instr)

{
  code *pcVar1;
  anon_class_24_3_a467b3e1 map;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  Func **ppFVar5;
  BVUnitT<unsigned_long> local_20;
  BitVector spilledRegs;
  Instr *instr_local;
  LinearScan *this_local;
  
  spilledRegs.word = (Type)instr;
  iVar3 = JsUtil::ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>::Count
                    (&(this->currentBlock->inlineeStack).
                      super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>);
  if (iVar3 < 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0xd4c,"(this->currentBlock->inlineeStack.Count() > 0)",
                       "this->currentBlock->inlineeStack.Count() > 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  ppFVar5 = JsUtil::
            List<Func_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
            Last(&this->currentBlock->inlineeStack);
  *(Func **)(spilledRegs.word + 0x20) = *ppFVar5;
  BVUnitT<unsigned_long>::BVUnitT(&local_20,0);
  map.this = this;
  map.instr = (Instr **)&spilledRegs;
  map.spilledRegs = &local_20;
  JsUtil::List<Lifetime*,Memory::JitArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>::
  Map<LinearScan::SpillInlineeArgs(IR::Instr*)::__0>
            ((List<Lifetime*,Memory::JitArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer> *
             )this->currentBlock,map);
  return;
}

Assistant:

void LinearScan::SpillInlineeArgs(IR::Instr* instr)
{
    Assert(this->currentBlock->inlineeStack.Count() > 0);

    // Ensure the call instruction is tied to the current inlinee
    // This is used in the encoder to encode mapping or return offset and InlineeFrameRecord
    instr->m_func = this->currentBlock->inlineeStack.Last();

    BitVector spilledRegs;
    this->currentBlock->inlineeFrameLifetimes.Map([&](uint i, Lifetime* lifetime){
        Assert(lifetime->start < instr->GetNumber() && lifetime->end >= instr->GetNumber());
        Assert(!lifetime->sym->IsConst());
        Assert(this->currentBlock->inlineeFrameSyms.ContainsKey(lifetime->sym->m_id));
        if (lifetime->reg == RegNOREG)
        {
            return;
        }

        StackSym* sym = lifetime->sym;
        if (!lifetime->isSpilled && !lifetime->isOpHelperSpilled &&
            (!lifetime->isDeadStore && (lifetime->sym->m_isSingleDef || !lifetime->defList.Empty()))) // if deflist is empty - we have already spilled at all defs - and the value is current
        {
            if (!spilledRegs.Test(lifetime->reg))
            {
                spilledRegs.Set(lifetime->reg);
                if (!sym->IsAllocated())
                {
                    this->AllocateStackSpace(lifetime);
                }

                this->RecordLoopUse(lifetime, lifetime->reg);
                Assert(this->regContent[lifetime->reg] != nullptr);
                if (sym->m_isSingleDef)
                {
                    // For a single def - we do not track the deflist - the def below will remove the single def on the sym
                    // hence, we need to track the original def.
                    Assert(lifetime->defList.Empty());
                    lifetime->defList.Prepend(sym->m_instrDef);
                }

                this->InsertStore(instr->m_prev, sym, lifetime->reg);
            }
        }
    });
}